

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O1

void Ptex::v2_4::(anonymous_namespace)::Apply<unsigned_short,4>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  ulong *puVar1;
  float fVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  float *pfVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  ulong *puVar15;
  long lVar16;
  float *pfVar17;
  int iVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  bVar4 = (k->res).ulog2;
  iVar18 = 4 << (bVar4 & 0x1f);
  lVar16 = (long)iVar18 * (long)k->vw;
  if ((int)lVar16 != 0) {
    puVar15 = (ulong *)((long)data + ((long)(k->v << (bVar4 & 0x1f)) + (long)k->u) * 8);
    puVar1 = (ulong *)((long)puVar15 + lVar16 * 2);
    pfVar17 = k->kv;
    iVar5 = k->uw;
    pfVar6 = k->ku;
    do {
      uVar3 = *puVar15;
      auVar7._8_4_ = 0;
      auVar7._0_8_ = uVar3;
      auVar7._12_2_ = (short)(uVar3 >> 0x30);
      auVar9._8_2_ = (short)(uVar3 >> 0x20);
      auVar9._0_8_ = uVar3;
      auVar9._10_4_ = auVar7._10_4_;
      auVar13._6_8_ = 0;
      auVar13._0_6_ = auVar9._8_6_;
      auVar11._4_2_ = (short)(uVar3 >> 0x10);
      auVar11._0_4_ = (uint)uVar3;
      auVar11._6_8_ = SUB148(auVar13 << 0x40,6);
      fVar23 = *pfVar6;
      fVar20 = fVar23 * (float)((uint)uVar3 & 0xffff);
      fVar21 = fVar23 * (float)auVar11._4_4_;
      fVar22 = fVar23 * (float)auVar9._8_4_;
      fVar23 = fVar23 * (float)(auVar7._10_4_ >> 0x10);
      if (iVar5 != 1) {
        lVar19 = 4;
        lVar16 = 0;
        do {
          uVar3 = *(ulong *)((long)puVar15 + lVar19 * 2);
          auVar8._8_4_ = 0;
          auVar8._0_8_ = uVar3;
          auVar8._12_2_ = (short)(uVar3 >> 0x30);
          auVar10._8_2_ = (short)(uVar3 >> 0x20);
          auVar10._0_8_ = uVar3;
          auVar10._10_4_ = auVar8._10_4_;
          auVar14._6_8_ = 0;
          auVar14._0_6_ = auVar10._8_6_;
          auVar12._4_2_ = (short)(uVar3 >> 0x10);
          auVar12._0_4_ = (uint)uVar3;
          auVar12._6_8_ = SUB148(auVar14 << 0x40,6);
          fVar2 = *(float *)((long)pfVar6 + lVar19);
          fVar20 = fVar20 + fVar2 * (float)((uint)uVar3 & 0xffff);
          fVar21 = fVar21 + fVar2 * (float)auVar12._4_4_;
          fVar22 = fVar22 + fVar2 * (float)auVar10._8_4_;
          fVar23 = fVar23 + fVar2 * (float)(auVar8._10_4_ >> 0x10);
          lVar16 = lVar16 + -8;
          lVar19 = lVar19 + 4;
        } while ((long)(iVar5 * 4) * -2 + 8 != lVar16);
        puVar15 = (ulong *)((long)puVar15 - lVar16);
      }
      fVar2 = *pfVar17;
      pfVar17 = pfVar17 + 1;
      *result = fVar2 * fVar20 + *result;
      result[1] = fVar2 * fVar21 + result[1];
      result[2] = fVar2 * fVar22 + result[2];
      result[3] = fVar2 * fVar23 + result[3];
      puVar15 = (ulong *)((long)puVar15 + (long)(iVar18 + iVar5 * -4) * 2 + 8);
    } while (puVar15 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }